

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandQuit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"hs");
  if (iVar1 == -1) {
    if (argc == globalUtilOptind) {
      return -1;
    }
  }
  else if ((iVar1 != 0x68) && (iVar1 == 0x73)) {
    return -2;
  }
  fprintf((FILE *)pAbc->Err,"usage: quit [-sh]\n");
  fprintf((FILE *)pAbc->Err,"   -h  print the command usage\n");
  fprintf((FILE *)pAbc->Err,"   -s  frees all the memory before quitting\n");
  return 1;
}

Assistant:

int CmdCommandQuit( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "hs" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
            break;
        case 's':
            return -2;
            break;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;
    return -1;

  usage:
    fprintf( pAbc->Err, "usage: quit [-sh]\n" );
    fprintf( pAbc->Err, "   -h  print the command usage\n" );
    fprintf( pAbc->Err, "   -s  frees all the memory before quitting\n" );
    return 1;
}